

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O1

int tool_readbusy_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  timediff_t tVar5;
  long lVar6;
  long lVar7;
  curltime cVar8;
  curltime newer;
  
  lVar2 = *(long *)((long)clientp + 0x10);
  if ((*(byte *)(lVar2 + 0x4e7) & 0x20) != 0) {
    if (tool_readbusy_cb::ulprev == ulnow) {
      cVar8 = curlx_now();
      lVar3 = cVar8.tv_sec;
      iVar4 = cVar8.tv_usec;
      if (tool_readbusy_cb_prev_0 != 0) {
        lVar7 = tool_readbusy_cb::rate + 3;
        if (-1 < tool_readbusy_cb::rate) {
          lVar7 = tool_readbusy_cb::rate;
        }
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar8._0_12_,0);
        newer.tv_usec = SUB124(cVar8._0_12_,8);
        cVar8.tv_usec = tool_readbusy_cb_prev_1;
        cVar8.tv_sec = tool_readbusy_cb_prev_0;
        cVar8._12_4_ = 0;
        tVar5 = curlx_timediff(newer,cVar8);
        lVar6 = tVar5 + 3;
        if (-1 < tVar5) {
          lVar6 = tVar5;
        }
        tool_readbusy_cb::rate = tool_readbusy_cb::rate + ((lVar6 >> 2) - (lVar7 >> 2));
      }
    }
    else {
      tool_readbusy_cb::rate = 0x32;
      lVar3 = tool_readbusy_cb_prev_0;
      iVar4 = tool_readbusy_cb_prev_1;
      tool_readbusy_cb::ulprev = ulnow;
    }
    tool_readbusy_cb_prev_1 = iVar4;
    tool_readbusy_cb_prev_0 = lVar3;
    if (tool_readbusy_cb::rate < 0x32) {
      tool_go_sleep(0x19);
    }
    else {
      pbVar1 = (byte *)(lVar2 + 0x4e7);
      *pbVar1 = *pbVar1 & 0xdf;
      curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
    }
  }
  iVar4 = 0x10000001;
  if ((*(byte *)((long)clientp + 0x1d8) & 2) != 0) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int tool_readbusy_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;

  (void)dltotal;  /* unused */
  (void)dlnow;  /* unused */
  (void)ultotal;  /* unused */
  (void)ulnow;  /* unused */

  if(config->readbusy) {
    /* lame code to keep the rate down because the input might not deliver
       anything, get paused again and come back here immediately */
    static timediff_t rate = 500;
    static struct curltime prev;
    static curl_off_t ulprev;

    if(ulprev == ulnow) {
      /* it did not upload anything since last call */
      struct curltime now = curlx_now();
      if(prev.tv_sec)
        /* get a rolling average rate */
        rate -= rate/4 - curlx_timediff(now, prev)/4;
      prev = now;
    }
    else {
      rate = 50;
      ulprev = ulnow;
    }
    if(rate >= 50) {
      /* keeps the looping down to 20 times per second in the crazy case */
      config->readbusy = FALSE;
      curl_easy_pause(per->curl, CURLPAUSE_CONT);
    }
    else
      /* sleep half a period */
      tool_go_sleep(25);
  }

  return per->noprogress ? 0 : CURL_PROGRESSFUNC_CONTINUE;
}